

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation_half.cpp
# Opt level: O0

int MyTest_TestFormula_Test::AddToRegistry(void)

{
  ParameterizedTestSuiteInfo<MyTest> *a_file;
  TestMetaFactory<MyTest_TestFormula_Test> *this;
  undefined8 in_stack_ffffffffffffff00;
  int iVar1;
  string *in_stack_ffffffffffffff08;
  CodeLocation *this_00;
  allocator<char> local_d1;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  CodeLocation *in_stack_ffffffffffffff70;
  TestMetaFactoryBase<std::tuple<unsigned_long,_unsigned_long>_> *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  CodeLocation *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  ParameterizedTestSuiteRegistry *in_stack_ffffffffffffffe0;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  testing::UnitTest::GetInstance();
  testing::UnitTest::parameterized_test_registry((UnitTest *)0x1bc064);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  this_00 = (CodeLocation *)&stack0xffffffffffffff7f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  testing::internal::CodeLocation::CodeLocation(this_00,in_stack_ffffffffffffff08,iVar1);
  a_file = testing::internal::ParameterizedTestSuiteRegistry::GetTestSuitePatternHolder<MyTest>
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)
  ;
  this = (TestMetaFactory<MyTest_TestFormula_Test> *)operator_new(8);
  (this->super_TestMetaFactoryBase<std::tuple<unsigned_long,_unsigned_long>_>).
  _vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::TestMetaFactory<MyTest_TestFormula_Test>::TestMetaFactory(this);
  iVar1 = (int)((ulong)this >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  testing::internal::CodeLocation::CodeLocation(this_00,(string *)a_file,iVar1);
  testing::internal::ParameterizedTestSuiteInfo<MyTest>::AddTestPattern
            ((ParameterizedTestSuiteInfo<MyTest> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70);
  testing::internal::CodeLocation::~CodeLocation((CodeLocation *)0x1bc18b);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  std::allocator<char>::~allocator(&local_d1);
  testing::internal::CodeLocation::~CodeLocation((CodeLocation *)0x1bc1ac);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdf);
  return 0;
}

Assistant:

TEST_P(MyTest, TestFormula)
{
    uint64_t const in_number = std::get<0>(GetParam());
    uint64_t const out_number = std::get<1>(GetParam());

    fp_t d = reinterpret_double_bits_as(in_number);
    fp_t expected = reinterpret_double_bits_as(out_number);

    // IEEE half.
    flexfloat<5, 10> fx = d;
    fp_t recoverd_fx = (fp_t)(fx);

     printf("number:     \t"); show(d);
     printf("recoverd_fx:\t"); show(recoverd_fx);
     printf("expected:   \t"); show(expected);

    // Enforces the same reprsentation for nan's.
    uint_t out = reinterpret_as_double_bits(recoverd_fx);

    #ifndef FLEXFLOAT_ON_SINGLE
    #ifdef FLEXFLOAT_ROUNDING
    ASSERT_EQ(out, out_number);
    #endif
    #endif
    // ASSERT_EQ(recoverd_fx, expected); // does not work for NAN's.
}